

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsResub.c
# Opt level: O2

int Abc_NtkMfsSolveSatResub2(Mfs_Man_t *p,Abc_Obj_t *pNode,int iFanin,int iFanin2)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  abctime aVar4;
  Hop_Obj_t *pFunc;
  abctime aVar5;
  void *pvVar6;
  Abc_Obj_t *pAVar7;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  Vec_Ptr_t *pVVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  bool bVar18;
  float fVar19;
  int local_a0;
  int pCands [12];
  
  if (p->pPars->fVeryVerbose == 0) {
    bVar1 = false;
  }
  else {
    bVar1 = p->vDivs->nSize < 0x50;
  }
  if (iFanin < 0) {
    __assert_fail("iFanin >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/mfs/mfsResub.c"
                  ,0x148,"int Abc_NtkMfsSolveSatResub2(Mfs_Man_t *, Abc_Obj_t *, int, int)");
  }
  if (iFanin2 < -1) {
    __assert_fail("iFanin2 >= 0 || iFanin2 == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/mfs/mfsResub.c"
                  ,0x149,"int Abc_NtkMfsSolveSatResub2(Mfs_Man_t *, Abc_Obj_t *, int, int)");
  }
  Vec_PtrFillSimInfo(p->vDivCexes,p->nDivWords,iFanin);
  p->nCexes = 0;
  if (bVar1) {
    putchar(10);
    uVar13 = pNode->Id;
    uVar15 = *(uint *)&pNode->field_0x14;
    iVar14 = p->vDivs->nSize;
    uVar11 = (pNode->vFanins).nSize;
    pAVar7 = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[(uint)iFanin]];
    uVar17 = 0;
    if ((pAVar7->vFanouts).nSize == 1) {
      uVar2 = Abc_NodeMffcLabel(pAVar7);
      uVar17 = (ulong)uVar2;
    }
    printf("Node %5d : Level = %2d. Divs = %3d.  Fanins = %d/%d (out of %d). MFFC = %d\n",
           (ulong)uVar13,(ulong)(uVar15 >> 0xc),(ulong)(iVar14 - uVar11),(ulong)(uint)iFanin,
           (ulong)(uint)iFanin2,(ulong)uVar11,uVar17);
  }
  p->vMfsFanins->nSize = 0;
  iVar14 = 0;
  for (uVar17 = 0; (long)uVar17 < (long)(pNode->vFanins).nSize; uVar17 = uVar17 + 1) {
    if ((uint)iFanin2 != uVar17 && (uint)iFanin != uVar17) {
      Vec_PtrPush(p->vMfsFanins,pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[uVar17]]);
      iVar3 = Vec_IntEntry(p->vProjVarsSat,(p->vDivs->nSize - (pNode->vFanins).nSize) + (int)uVar17)
      ;
      pCands[iVar14] = iVar3 * 2 + 1;
      iVar14 = iVar14 + 1;
    }
  }
  iVar3 = Abc_NtkMfsTryResubOnce(p,pCands,iVar14);
  if (iVar3 == -1) {
    local_a0 = 0;
  }
  else if (iVar3 == 1) {
    local_a0 = 0;
    if (bVar1) {
      printf("Node %d: Fanins %d/%d can be removed.\n",(ulong)(uint)pNode->Id,(ulong)(uint)iFanin,
             (ulong)(uint)iFanin2);
    }
    p->nNodesResub = p->nNodesResub + 1;
    p->nNodesGainedLevel = p->nNodesGainedLevel + 1;
    aVar4 = Abc_Clock();
    pFunc = Abc_NtkMfsInterplate(p,pCands,iVar14);
    if (pFunc != (Hop_Obj_t *)0x0) {
      pVVar12 = p->vMfsFanins;
LAB_003cbedd:
      Abc_NtkMfsUpdateNetwork(p,pNode,pVVar12,pFunc);
      aVar5 = Abc_Clock();
      p->timeInt = p->timeInt + (aVar5 - aVar4);
      local_a0 = 1;
    }
  }
  else {
    if (bVar1) {
      iVar3 = 0xb;
      while (bVar18 = iVar3 != 0, iVar3 = iVar3 + -1, bVar18) {
        putchar(0x20);
      }
      uVar13 = 0;
      while( true ) {
        iVar3 = (pNode->vFanins).nSize;
        if (p->vDivs->nSize - iVar3 <= (int)uVar13) break;
        printf("%d",(ulong)uVar13 % 10);
        uVar13 = uVar13 + 1;
      }
      for (iVar16 = 0; iVar16 < iVar3; iVar16 = iVar16 + 1) {
        iVar3 = iVar16 + 0x61;
        if (iVar16 == iFanin2) {
          iVar3 = 0x2a;
        }
        if (iVar16 == iFanin) {
          iVar3 = 0x2a;
        }
        putchar(iVar3);
        iVar3 = (pNode->vFanins).nSize;
      }
      putchar(10);
    }
    iVar3 = iVar14 + 2;
    uVar13 = p->nCexes;
    uVar15 = 0xffffffff;
    uVar11 = 0xffffffff;
    do {
      uVar17 = (ulong)uVar13;
      if (bVar1) {
        printf("%3d: %2d %2d ",uVar17,uVar11,(ulong)uVar15);
        for (iVar16 = 0; iVar16 < p->vDivs->nSize; iVar16 = iVar16 + 1) {
          pvVar6 = Vec_PtrEntry(p->vDivCexes,iVar16);
          uVar13 = p->nCexes - 1;
          printf("%d",(ulong)((*(uint *)((long)pvVar6 + (long)((int)uVar13 >> 5) * 4) >>
                               (uVar13 & 0x1f) & 1) != 0));
        }
        putchar(10);
        uVar17 = (ulong)(uint)p->nCexes;
      }
      uVar13 = (((int)uVar17 >> 5) + 1) - (uint)((uVar17 & 0x1f) == 0);
      if (p->nDivWords < (int)uVar13) {
        __assert_fail("nWords <= p->nDivWords",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/mfs/mfsResub.c"
                      ,0x195,"int Abc_NtkMfsSolveSatResub2(Mfs_Man_t *, Abc_Obj_t *, int, int)");
      }
      uVar17 = 0;
      if (0 < (int)uVar13) {
        uVar17 = (ulong)uVar13;
      }
      for (uVar11 = 1; uVar2 = p->vDivs->nSize - (pNode->vFanins).nSize, (int)uVar11 < (int)uVar2;
          uVar11 = uVar11 + 1) {
        pvVar6 = Vec_PtrEntry(p->vDivCexes,uVar11);
        if (p->pPars->fPower == 0) {
LAB_003cc0c2:
          for (uVar15 = 0; uVar2 = uVar11, uVar15 != uVar11; uVar15 = uVar15 + 1) {
            pvVar8 = Vec_PtrEntry(p->vDivCexes,uVar15);
            if (p->pPars->fPower == 0) {
LAB_003cc107:
              uVar9 = 0;
              while ((uVar10 = uVar17, uVar17 != uVar9 &&
                     (uVar10 = uVar9,
                     (*(uint *)((long)pvVar8 + uVar9 * 4) | *(uint *)((long)pvVar6 + uVar9 * 4)) ==
                     0xffffffff))) {
                uVar9 = uVar9 + 1;
              }
              if ((uint)uVar10 == uVar13) {
                uVar2 = p->vDivs->nSize - (pNode->vFanins).nSize;
                goto LAB_003cc155;
              }
            }
            else {
              pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs,uVar15);
              fVar19 = Abc_MfsObjProb(p,pAVar7);
              if (fVar19 < 0.12) goto LAB_003cc107;
            }
          }
        }
        else {
          pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs,uVar11);
          fVar19 = Abc_MfsObjProb(p,pAVar7);
          uVar2 = uVar15;
          if (fVar19 < 0.12) goto LAB_003cc0c2;
        }
        uVar15 = uVar2;
      }
LAB_003cc155:
      local_a0 = 0;
      if (uVar11 == uVar2) {
        return 0;
      }
      iVar16 = Vec_IntEntry(p->vProjVarsSat,uVar15);
      pCands[iVar14] = iVar16 * 2 + 1;
      iVar16 = Vec_IntEntry(p->vProjVarsSat,uVar11);
      pCands[iVar14 + 1] = iVar16 * 2 + 1;
      iVar16 = Abc_NtkMfsTryResubOnce(p,pCands,iVar3);
      if (iVar16 == -1) {
        return 0;
      }
      if (iVar16 == 1) {
        if (bVar1) {
          printf("Node %d: Fanins %d/%d can be replaced by divisors %d/%d.\n",(ulong)(uint)pNode->Id
                 ,(ulong)(uint)iFanin,(ulong)(uint)iFanin2,uVar11,(ulong)uVar15);
        }
        p->nNodesResub = p->nNodesResub + 1;
        p->nNodesGainedLevel = p->nNodesGainedLevel + 1;
        aVar4 = Abc_Clock();
        pFunc = Abc_NtkMfsInterplate(p,pCands,iVar3);
        if (pFunc == (Hop_Obj_t *)0x0) {
          return 0;
        }
        pVVar12 = p->vMfsFanins;
        pvVar6 = Vec_PtrEntry(p->vDivs,uVar15);
        Vec_PtrPush(pVVar12,pvVar6);
        pVVar12 = p->vMfsFanins;
        pvVar6 = Vec_PtrEntry(p->vDivs,uVar11);
        Vec_PtrPush(pVVar12,pvVar6);
        pVVar12 = p->vMfsFanins;
        if (pVVar12->nSize != iVar3) {
          __assert_fail("Vec_PtrSize(p->vMfsFanins) == nCands + 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/mfs/mfsResub.c"
                        ,0x1d1,"int Abc_NtkMfsSolveSatResub2(Mfs_Man_t *, Abc_Obj_t *, int, int)");
        }
        goto LAB_003cbedd;
      }
      uVar13 = p->nCexes;
    } while ((int)uVar13 < p->pPars->nWinMax);
  }
  return local_a0;
}

Assistant:

int Abc_NtkMfsSolveSatResub2( Mfs_Man_t * p, Abc_Obj_t * pNode, int iFanin, int iFanin2 )
{
    int fVeryVerbose = p->pPars->fVeryVerbose && Vec_PtrSize(p->vDivs) < 80;
    unsigned * pData, * pData2;
    int pCands[MFS_FANIN_MAX];
    int RetValue, iVar, iVar2, i, w, nCands, nWords, fBreak;
    abctime clk;
    Abc_Obj_t * pFanin;
    Hop_Obj_t * pFunc;
    assert( iFanin >= 0 );
    assert( iFanin2 >= 0 || iFanin2 == -1 );

    // clean simulation info
    Vec_PtrFillSimInfo( p->vDivCexes, 0, p->nDivWords ); 
    p->nCexes = 0;
    if ( fVeryVerbose )
    {
        printf( "\n" );
        printf( "Node %5d : Level = %2d. Divs = %3d.  Fanins = %d/%d (out of %d). MFFC = %d\n", 
            pNode->Id, pNode->Level, Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode), 
            iFanin, iFanin2, Abc_ObjFaninNum(pNode), 
            Abc_ObjFanoutNum(Abc_ObjFanin(pNode, iFanin)) == 1 ? Abc_NodeMffcLabel(Abc_ObjFanin(pNode, iFanin)) : 0 );
    }

    // try fanins without the critical fanin
    nCands = 0;
    Vec_PtrClear( p->vMfsFanins );
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        if ( i == iFanin || i == iFanin2 )
            continue;
        Vec_PtrPush( p->vMfsFanins, pFanin );
        iVar = Vec_PtrSize(p->vDivs) - Abc_ObjFaninNum(pNode) + i;
        pCands[nCands++] = toLitCond( Vec_IntEntry( p->vProjVarsSat, iVar ), 1 );
    }
    RetValue = Abc_NtkMfsTryResubOnce( p, pCands, nCands );
    if ( RetValue == -1 )
        return 0;
    if ( RetValue == 1 )
    {
        if ( fVeryVerbose )
        printf( "Node %d: Fanins %d/%d can be removed.\n", pNode->Id, iFanin, iFanin2 );
        p->nNodesResub++;
        p->nNodesGainedLevel++;
clk = Abc_Clock();
        // derive the function
        pFunc = Abc_NtkMfsInterplate( p, pCands, nCands );
        if ( pFunc == NULL )
            return 0;
        // update the network
        Abc_NtkMfsUpdateNetwork( p, pNode, p->vMfsFanins, pFunc );
p->timeInt += Abc_Clock() - clk;
        return 1;
    }

    if ( fVeryVerbose )
    {
        for ( i = 0; i < 11; i++ )
            printf( " " );
        for ( i = 0; i < Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode); i++ )
            printf( "%d", i % 10 );
        for ( i = 0; i < Abc_ObjFaninNum(pNode); i++ )
            if ( i == iFanin || i == iFanin2 )
                printf( "*" );
            else
                printf( "%c", 'a' + i );
        printf( "\n" );
    }
    iVar = iVar2 = -1;
    while ( 1 )
    {
#if 1 // sjang
#endif
        if ( fVeryVerbose )
        {
            printf( "%3d: %2d %2d ", p->nCexes, iVar, iVar2 );
            for ( i = 0; i < Vec_PtrSize(p->vDivs); i++ )
            {
                pData = (unsigned *)Vec_PtrEntry( p->vDivCexes, i );
                printf( "%d", Abc_InfoHasBit(pData, p->nCexes-1) );
            }
            printf( "\n" );
        }

        // find the next divisor to try
        nWords = Abc_BitWordNum(p->nCexes);
        assert( nWords <= p->nDivWords );
        fBreak = 0;
        for ( iVar = 1; iVar < Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode); iVar++ )
        {
            pData  = (unsigned *)Vec_PtrEntry( p->vDivCexes, iVar );
#if 1  // sjang
            if ( p->pPars->fPower )
            {
                Abc_Obj_t * pDiv = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs, iVar);
                // only accept the divisor if it is "cool"
                if ( Abc_MfsObjProb(p, pDiv) >= 0.12 )
                    continue;
            }
#endif
            for ( iVar2 = 0; iVar2 < iVar; iVar2++ )
            {
                pData2 = (unsigned *)Vec_PtrEntry( p->vDivCexes, iVar2 );
#if 1 // sjang
	            if ( p->pPars->fPower )
		        {
			        Abc_Obj_t * pDiv = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs, iVar2);
				    // only accept the divisor if it is "cool"
					if ( Abc_MfsObjProb(p, pDiv) >= 0.12 )
						continue;
	            }
#endif
                for ( w = 0; w < nWords; w++ )
                    if ( (pData[w] | pData2[w]) != ~0 )
                        break;
                if ( w == nWords )
                {
                    fBreak = 1;
                    break;
                }
            }
            if ( fBreak )
                break;
        }
        if ( iVar == Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode) )
            return 0;

        pCands[nCands]   = toLitCond( Vec_IntEntry(p->vProjVarsSat, iVar2), 1 );
        pCands[nCands+1] = toLitCond( Vec_IntEntry(p->vProjVarsSat, iVar), 1 );
        RetValue = Abc_NtkMfsTryResubOnce( p, pCands, nCands+2 );
        if ( RetValue == -1 )
            return 0;
        if ( RetValue == 1 )
        {
            if ( fVeryVerbose )
            printf( "Node %d: Fanins %d/%d can be replaced by divisors %d/%d.\n", pNode->Id, iFanin, iFanin2, iVar, iVar2 );
            p->nNodesResub++;
            p->nNodesGainedLevel++;
clk = Abc_Clock();
            // derive the function
            pFunc = Abc_NtkMfsInterplate( p, pCands, nCands+2 );
            if ( pFunc == NULL )
                return 0;
            // update the network
            Vec_PtrPush( p->vMfsFanins, Vec_PtrEntry(p->vDivs, iVar2) );
            Vec_PtrPush( p->vMfsFanins, Vec_PtrEntry(p->vDivs, iVar) );
            assert( Vec_PtrSize(p->vMfsFanins) == nCands + 2 );
            Abc_NtkMfsUpdateNetwork( p, pNode, p->vMfsFanins, pFunc );
p->timeInt += Abc_Clock() - clk;
            return 1;
        }
        if ( p->nCexes >= p->pPars->nWinMax )
            break;
    }
    return 0;
}